

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodemv.c
# Opt level: O0

void av1_find_best_ref_mvs_from_stack
               (int allow_hp,MB_MODE_INFO_EXT *mbmi_ext,MV_REFERENCE_FRAME ref_frame,
               int_mv *nearest_mv,int_mv *near_mv,int is_integer)

{
  int_mv iVar1;
  int_mv *in_RCX;
  undefined1 in_DL;
  int_mv *in_R8;
  MV_REFERENCE_FRAME ref_frames [2];
  int ref_idx;
  int in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  MB_MODE_INFO_EXT *in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffc8;
  undefined2 in_stack_ffffffffffffffcc;
  undefined1 uVar2;
  int ref_idx_00;
  
  ref_idx_00 = 0;
  uVar2 = 0xff;
  iVar1 = av1_get_ref_mv_from_stack
                    (0,(MV_REFERENCE_FRAME *)
                       CONCAT17(0xff,CONCAT16(in_DL,CONCAT24(in_stack_ffffffffffffffcc,
                                                             in_stack_ffffffffffffffc8))),
                     in_stack_ffffffffffffffc4,in_stack_ffffffffffffffb8);
  *in_RCX = iVar1;
  lower_mv_precision(&in_RCX->as_mv,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
  iVar1 = av1_get_ref_mv_from_stack
                    (ref_idx_00,
                     (MV_REFERENCE_FRAME *)
                     CONCAT17(uVar2,CONCAT16(in_DL,CONCAT24(in_stack_ffffffffffffffcc,iVar1.as_int))
                             ),in_stack_ffffffffffffffc4,(MB_MODE_INFO_EXT *)&in_R8->as_mv);
  *in_R8 = iVar1;
  lower_mv_precision(&in_RCX->as_mv,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
  return;
}

Assistant:

void av1_find_best_ref_mvs_from_stack(int allow_hp,
                                      const MB_MODE_INFO_EXT *mbmi_ext,
                                      MV_REFERENCE_FRAME ref_frame,
                                      int_mv *nearest_mv, int_mv *near_mv,
                                      int is_integer) {
  const int ref_idx = 0;
  MV_REFERENCE_FRAME ref_frames[2] = { ref_frame, NONE_FRAME };
  *nearest_mv = av1_get_ref_mv_from_stack(ref_idx, ref_frames, 0, mbmi_ext);
  lower_mv_precision(&nearest_mv->as_mv, allow_hp, is_integer);
  *near_mv = av1_get_ref_mv_from_stack(ref_idx, ref_frames, 1, mbmi_ext);
  lower_mv_precision(&near_mv->as_mv, allow_hp, is_integer);
}